

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benckmark.cpp
# Opt level: O3

void __thiscall BenchMark::run(BenchMark *this)

{
  size_t sVar1;
  ostream *poVar2;
  ulong uVar3;
  int i;
  Thread *thread;
  pthread_t *__newthread;
  ThreadPool threadPool;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _union_1457 local_c8;
  sigset_t local_c0;
  undefined4 local_40;
  
  g_is_loop = true;
  memset(&local_c0,0,0x90);
  local_c8.sa_handler = timerHandle;
  local_40 = 0x10000000;
  sigfillset(&local_c0);
  sigaction(0xe,(sigaction *)&local_c8,(sigaction *)0x0);
  memset(&local_c0,0,0x90);
  local_c8.sa_handler = timerHandle;
  local_40 = 0x10000000;
  sigfillset(&local_c0);
  sigaction(0xf,(sigaction *)&local_c8,(sigaction *)0x0);
  alarm(gOption.duration_);
  ThreadPool::ThreadPool((ThreadPool *)&local_c8,gOption.thread_num_ - 1);
  if (1 < gOption.thread_num_) {
    uVar3 = 1;
    do {
      local_e8._8_8_ = 0;
      local_e8._M_unused._M_object = operator_new(0x20);
      *(code **)local_e8._M_unused._0_8_ = benchmark;
      *(undefined8 *)((long)local_e8._M_unused._0_8_ + 8) = 0;
      *(int *)((long)local_e8._M_unused._0_8_ + 0x10) = (int)uVar3;
      *(BenchMark **)((long)local_e8._M_unused._0_8_ + 0x18) = this;
      local_d0 = std::
                 _Function_handler<void_(),_std::_Bind<void_(BenchMark::*(BenchMark_*,_int))(int)>_>
                 ::_M_invoke;
      local_d8 = std::
                 _Function_handler<void_(),_std::_Bind<void_(BenchMark::*(BenchMark_*,_int))(int)>_>
                 ::_M_manager;
      ThreadPool::appendTask((ThreadPool *)&local_c8,(ThreadTask *)&local_e8);
      if (local_d8 != (code *)0x0) {
        (*local_d8)(&local_e8,&local_e8,__destroy_functor);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < gOption.thread_num_);
  }
  local_c8._0_1_ = 1;
  for (__newthread = (pthread_t *)local_c0.__val[0]; __newthread != (pthread_t *)local_c0.__val[1];
      __newthread = __newthread + 5) {
    pthread_create(__newthread,(pthread_attr_t *)0x0,Thread::threadFun,__newthread);
  }
  benchmark(this,0);
  sVar1 = gOption.thread_num_;
  if (gOption.thread_num_ != 0) {
    do {
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"this is thread ",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," :\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tconnect  time : ",0x11);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," use : ",7);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," us\n",4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tuse      time : ",0x11);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," \n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\trequest  num  : ",0x11);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," \n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tresponse num  : ",0x11);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," \n",2);
      uVar3 = uVar3 + 1;
    } while (uVar3 < gOption.thread_num_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"total result : \n",0x10)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\ttotal request  num  is : ",0x1a);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\ttotal response num  is : ",0x1a);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\ttotal use     time  is : ",0x1a);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tQPS                 is : ",0x1a);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  ThreadPool::~ThreadPool((ThreadPool *)&local_c8);
  return;
}

Assistant:

void BenchMark::run()
{
    g_is_loop = true;
    //设置测试时间
    addsig(SIGALRM);
    addsig(SIGTERM);
    alarm(gOption.duration_);
 
    ThreadPool threadPool(gOption.thread_num_ - 1);
   
    for (int i = 1; i < gOption.thread_num_; ++i) {
        threadPool.appendTask(std::bind(&BenchMark::benchmark, this, i));
    }
    threadPool.run();
    benchmark(0);
    //threadPool.join();
    //sleep(1);
    //统计测试结果

    /*
     *  QPS = req/sec = 请求数/秒
     *  QPS = 总请求数 / ( 进程总数 *   请求时间 )
     *  QPS: 单个进程每秒请求服务器的成功次数
     *
     */
    uint64_t total_request_num = 0;
    uint64_t total_response_num = 0;
    uint64_t total_time = 0;
    for (int i = 0; i < gOption.thread_num_; ++i) {
        total_request_num += testResult_[i].request_num_;
        total_response_num += testResult_[i].response_num_;
        total_time += testResult_[i].use_timer_;
    }

    for(int i = 0;i < gOption.thread_num_;++i)
    {
        std::cout << "this is thread " << i << " :\n";
        std::cout << "\tconnect  time : " << gOption.concurrent_num_ << " use : " << testResult_[i].connect_time_ << " us\n";
        std::cout << "\tuse      time : " << testResult_[i].use_timer_ << " \n";
        std::cout << "\trequest  num  : " << testResult_[i].request_num_ << " \n";
        std::cout << "\tresponse num  : " << testResult_[i].response_num_ << " \n";
    }

    std::cout<<"total result : \n";
    std::cout << "\ttotal request  num  is : " << total_request_num << "\n";
    std::cout << "\ttotal response num  is : " << total_response_num << "\n";
    std::cout << "\ttotal use     time  is : " << total_time << "\n";
    std::cout << "\tQPS                 is : " << (total_response_num*(1000 * 1000) /total_time)*gOption.thread_num_   << "\n";
}